

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall
helics::apps::Connector::Connector
          (Connector *this,string_view appName,shared_ptr<helics::Core> *coreObj,
          FederateInfo *fedInfo)

{
  element_type *peVar1;
  _func_int *p_Var2;
  shared_ptr<helics::Core> local_58 [2];
  ConnectionsType *local_38;
  
  apps::App::App(&this->super_App,appName,coreObj,fedInfo);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Connector_004c9470;
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_58[0].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58[0].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var2 = (peVar1->super_ValueFederate)._vptr_ValueFederate[-3];
    local_58[0].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(&(peVar1->super_ValueFederate).field_0x18 + (long)p_Var2);
    local_58[0].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          (&(peVar1->super_ValueFederate).field_0x20 + (long)p_Var2);
    if (local_58[0].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_58[0].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_58[0].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_58[0].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_58[0].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
  }
  CoreApp::CoreApp(&this->core,local_58);
  if (local_58[0].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_58[0].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  (this->connections)._M_h._M_buckets = &(this->connections)._M_h._M_single_bucket;
  (this->connections)._M_h._M_bucket_count = 1;
  (this->connections)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->connections)._M_h._M_element_count = 0;
  (this->connections)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->connections)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->connections)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->matchers).
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->matchers).
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->matchers).
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->regexMatchers).
  super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->regexMatchers).
  super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->regexMatchers).
  super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tags)._M_h._M_buckets = &(this->tags)._M_h._M_single_bucket;
  (this->tags)._M_h._M_bucket_count = 1;
  (this->tags)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tags)._M_h._M_element_count = 0;
  (this->tags)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tags)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tags)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interfaces)._M_h._M_buckets = &(this->interfaces)._M_h._M_single_bucket;
  (this->interfaces)._M_h._M_bucket_count = 1;
  (this->interfaces)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interfaces)._M_h._M_element_count = 0;
  (this->interfaces)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interfaces)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interfaces)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->matchCount = 0;
  this->interfacesRequested = 0;
  *(undefined4 *)((long)&this->interfacesRequested + 7) = 0;
  if ((this->super_App).deactivated == false) {
    local_38 = &this->connections;
    peVar1 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar1->super_ValueFederate)._vptr_ValueFederate[2])(peVar1,4,1);
    apps::App::loadInputFiles(&this->super_App);
  }
  return;
}

Assistant:

Connector::Connector(std::string_view appName,
                     const std::shared_ptr<Core>& coreObj,
                     const FederateInfo& fedInfo):
    App(appName, coreObj, fedInfo), core((fed) ? fed->getCorePointer() : nullptr)
{
    initialSetup();
}